

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bz2_stream.cpp
# Opt level: O2

void __thiscall minibag::BZ2Stream::startWrite(BZ2Stream *this)

{
  FILE *f;
  BZFILE *b;
  BagException *this_00;
  allocator<char> local_39;
  string local_38;
  
  f = Stream::getFilePointer(&this->super_Stream);
  b = BZ2_bzWriteOpen(&this->bzerror_,f,this->block_size_100k_,this->verbosity_,this->work_factor_);
  this->bzfile_ = b;
  if (this->bzerror_ == 0) {
    Stream::setCompressedIn(&this->super_Stream,0);
    return;
  }
  BZ2_bzWriteClose(&this->bzerror_,b,0,(uint *)0x0,(uint *)0x0);
  this_00 = (BagException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Error opening file for writing compressed stream",&local_39);
  BagException::BagException(this_00,&local_38);
  __cxa_throw(this_00,&BagException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BZ2Stream::startWrite() {
    bzfile_ = BZ2_bzWriteOpen(&bzerror_, getFilePointer(), block_size_100k_, verbosity_, work_factor_);

    switch (bzerror_) {
        case BZ_OK: break;
        default: {
            BZ2_bzWriteClose(&bzerror_, bzfile_, 0, NULL, NULL);
            throw BagException("Error opening file for writing compressed stream");
        }
    }

    setCompressedIn(0);
}